

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_casts.cpp
# Opt level: O2

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::BindEnumCast(duckdb *this,BindCastInput *input,LogicalType *source,LogicalType *target)

{
  BoundCastInfo local_70;
  LogicalType local_58;
  BoundCastInfo local_40;
  
  LogicalType::LogicalType((LogicalType *)&local_70,VARCHAR);
  BindCastInput::GetCastFunction(&local_40,input,source,(LogicalType *)&local_70);
  LogicalType::~LogicalType((LogicalType *)&local_70);
  LogicalType::LogicalType(&local_58,VARCHAR);
  BindCastInput::GetCastFunction(&local_70,input,&local_58,target);
  LogicalType::~LogicalType(&local_58);
  make_uniq<duckdb::EnumBoundCastData,duckdb::BoundCastInfo,duckdb::BoundCastInfo>
            ((duckdb *)&local_58,&local_40,&local_70);
  *(undefined8 *)this = local_58._0_8_;
  if (local_70.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_70.cast_data.
        super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
        super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
        .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl)[1])();
  }
  if ((__uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
      local_40.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)0x0) {
    (*(*(_func_int ***)
        local_40.cast_data.
        super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
        super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
        .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl)[1])();
  }
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)this;
}

Assistant:

unique_ptr<BoundCastData> BindEnumCast(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	auto to_varchar_cast = input.GetCastFunction(source, LogicalType::VARCHAR);
	auto from_varchar_cast = input.GetCastFunction(LogicalType::VARCHAR, target);
	return make_uniq<EnumBoundCastData>(std::move(to_varchar_cast), std::move(from_varchar_cast));
}